

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *alloc;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  ctrl_t *__s;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  Layout LVar6;
  FindInfo FVar7;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, phmap::priv::(anonymous namespace)::balast>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<int, phmap::priv::(anonymous namespace)::balast>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>]"
                 );
  }
  alloc = (allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *)
          this->ctrl_;
  psVar1 = this->slots_;
  capacity = this->capacity_;
  LVar6 = MakeLayout(new_capacity);
  uVar5 = LVar6.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast>_>
          .size_[0] + 3 & 0xfffffffffffffffc;
  uVar3 = LVar6.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast>_>
          .size_[1] * 8 + uVar5;
  if (uVar3 == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 4UL, Alloc = std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>]"
                 );
  }
  if (-1 < (long)uVar3) {
    __s = (ctrl_t *)operator_new(uVar3);
    if (((ulong)__s & 3) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0x1064,
                    "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 4UL, Alloc = std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>]"
                   );
    }
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)(__s + uVar5);
    memset(__s,0x80,new_capacity + 0x10);
    __s[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar4 = 0;
      do {
        if (-1 < (char)alloc[sVar4]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)psVar1[sVar4].value.first;
          hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                    SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar7 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar7.offset,(byte)hashval & 0x7f);
          this->slots_[FVar7.offset] = psVar1[sVar4];
        }
        sVar4 = sVar4 + 1;
      } while (capacity != sVar4);
      LVar6 = MakeLayout(capacity);
      Deallocate<4ul,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>
                (alloc,(void *)((LVar6.
                                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast>_>
                                 .size_[0] + 3 & 0xfffffffffffffffc) +
                               LVar6.
                               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast>_>
                               .size_[1] * 8),
                 LVar6.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast>_>
                 .size_[1]);
      return;
    }
    return;
  }
  std::__throw_bad_alloc();
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }